

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::Add_80_10ffff(Compiler *this)

{
  int iVar1;
  long lVar2;
  int local_5c;
  int next;
  ByteRangeProg *p;
  int local_48;
  int i;
  int inst [12];
  Compiler *this_local;
  
  memset(&local_48,0,0x30);
  for (p._4_4_ = 0; p._4_4_ < 0xc; p._4_4_ = p._4_4_ + 1) {
    lVar2 = (long)p._4_4_ * 0xc;
    local_5c = 0;
    if (-1 < *(int *)(prog_80_10ffff + lVar2)) {
      local_5c = (&local_48)[*(int *)(prog_80_10ffff + lVar2)];
    }
    iVar1 = UncachedRuneByteSuffix
                      (this,(uint8)*(undefined4 *)(prog_80_10ffff + lVar2 + 4),
                       (uint8)*(undefined4 *)(prog_80_10ffff + lVar2 + 8),false,local_5c);
    (&local_48)[p._4_4_] = iVar1;
    if ((*(uint *)(prog_80_10ffff + lVar2 + 4) & 0xc0) != 0x80) {
      AddSuffix(this,(&local_48)[p._4_4_]);
    }
  }
  return;
}

Assistant:

void Compiler::Add_80_10ffff() {
  int inst[arraysize(prog_80_10ffff)] = { 0 }; // does not need to be initialized; silences gcc warning
  for (int i = 0; i < arraysize(prog_80_10ffff); i++) {
    const ByteRangeProg& p = prog_80_10ffff[i];
    int next = 0;
    if (p.next >= 0)
      next = inst[p.next];
    inst[i] = UncachedRuneByteSuffix(static_cast<uint8>(p.lo),
                                     static_cast<uint8>(p.hi), false, next);
    if ((p.lo & 0xC0) != 0x80)
      AddSuffix(inst[i]);
  }
}